

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UStringTrieResult __thiscall icu_63::UCharsTrie::next(UCharsTrie *this,int32_t uchar)

{
  char16_t cVar1;
  UChar UVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  uint uVar6;
  UStringTrieResult UVar7;
  UChar *pos;
  uint length;
  
  pcVar4 = this->pos_;
  UVar7 = USTRINGTRIE_NO_MATCH;
  if (pcVar4 != (char16_t *)0x0) {
    iVar3 = this->remainingMatchLength_;
    if (iVar3 < 0) {
      pos = pcVar4 + 1;
      uVar6 = (ushort)*pcVar4 & 0x3f;
      uVar5 = (uint)(ushort)*pcVar4;
      while( true ) {
        length = uVar5;
        if (length < 0x30) {
          UVar7 = branchNext(this,pos,length,uchar);
          return UVar7;
        }
        if (length < 0x40) break;
        if (0x7fff < length) goto LAB_002930aa;
        uVar5 = uVar6;
        if (0x403f < length) {
          pos = pos + (ulong)(0x7fbf < length) + 1;
        }
      }
      if ((uint)(ushort)*pos == uchar) {
        this->remainingMatchLength_ = length - 0x31;
        this->pos_ = pos + 1;
        if (length != 0x30) {
          return USTRINGTRIE_NO_VALUE;
        }
        UVar2 = pos[1];
        if ((ushort)UVar2 < 0x40) {
          return USTRINGTRIE_NO_VALUE;
        }
        return (ushort)UVar2 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
LAB_002930aa:
      this->pos_ = (char16_t *)0x0;
      return USTRINGTRIE_NO_MATCH;
    }
    if ((uint)(ushort)*pcVar4 == uchar) {
      UVar7 = USTRINGTRIE_NO_VALUE;
      this->remainingMatchLength_ = iVar3 + -1;
      this->pos_ = pcVar4 + 1;
      if ((iVar3 == 0) && (cVar1 = pcVar4[1], 0x3f < (ushort)cVar1)) {
        return (ushort)cVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
    }
    else {
      this->pos_ = (char16_t *)0x0;
    }
  }
  return UVar7;
}

Assistant:

UStringTrieResult
UCharsTrie::next(int32_t uchar) {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(uchar==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, uchar);
}